

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_edge_face_uv
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  REF_GEOM pRVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  REF_INT cell_00;
  REF_INT ncell;
  REF_INT cell;
  REF_DBL faceuv [2];
  REF_INT cells [2];
  REF_DBL clipv [3];
  REF_DBL clipu [3];
  REF_INT tuv_sense;
  REF_DBL bary [3];
  REF_INT tri_nodes [27];
  REF_INT edg_nodes [27];
  REF_INT linear_nodes [27];
  int local_22c;
  REF_GEOM local_228;
  REF_INT local_21c;
  REF_DBL *local_218;
  int local_20c;
  undefined8 local_208;
  double local_200;
  REF_DBL local_1f8;
  REF_INT local_1f0 [2];
  REF_DBL local_1e8 [4];
  REF_DBL local_1c8 [3];
  REF_INT local_1ac;
  REF_DBL local_1a8 [4];
  REF_INT local_188;
  undefined8 local_184;
  REF_INT local_118 [28];
  REF_INT local_a8;
  undefined8 local_a4;
  REF_INT local_9c;
  
  pRVar1 = ref_facelift->grid->geom;
  local_1f8 = t;
  uVar3 = ref_egads_edge_face_uv(pRVar1,edgeid,faceid,sense,t,uv);
  uVar7 = (ulong)uVar3;
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x367,"ref_facelift_edge_face_uv",uVar7,"edge uv");
    return uVar3;
  }
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    if (sense != 0) {
      return 0;
    }
    local_228 = pRVar1;
    local_21c = edgeid;
    local_218 = uv;
    uVar3 = ref_facelift_enclosing(ref_facelift,1,edgeid,&local_1f8,&local_20c,local_1a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x371,"ref_facelift_edge_face_uv",(ulong)uVar3,"enclose");
      uVar7 = (ulong)uVar3;
    }
    if (uVar3 != 0) {
      return (REF_STATUS)uVar7;
    }
    if (local_20c == -1) {
      pcVar8 = "no enclosing found";
      uVar6 = 0x372;
    }
    else {
      uVar3 = ref_node_clip_bary2(local_1a8,local_1c8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x373,"ref_facelift_edge_face_uv",(ulong)uVar3,"clip edge bary");
        uVar7 = (ulong)uVar3;
      }
      if (uVar3 != 0) {
        return (REF_STATUS)uVar7;
      }
      uVar3 = ref_node_clip_bary2(local_1a8,local_1e8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x374,"ref_facelift_edge_face_uv",(ulong)uVar3,"clip edge bary");
        uVar7 = (ulong)uVar3;
      }
      if (uVar3 != 0) {
        return (REF_STATUS)uVar7;
      }
      uVar3 = ref_cell_nodes(ref_facelift->edg_cell,local_20c,local_118);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x376,"ref_facelift_edge_face_uv",(ulong)uVar3,"edg nodes");
        uVar7 = (ulong)uVar3;
      }
      if (uVar3 != 0) {
        return (REF_STATUS)uVar7;
      }
      uVar3 = ref_cell_list_with2(ref_facelift->tri_cell,local_118[0],local_118[1],2,&local_22c,
                                  local_1f0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x379,"ref_facelift_edge_face_uv",(ulong)uVar3,"more then two tris for edg");
        uVar7 = (ulong)uVar3;
      }
      if (uVar3 != 0) {
        return (REF_STATUS)uVar7;
      }
      if (local_22c < 1) {
        pcVar8 = "no tri found for edg";
        uVar6 = 0x37a;
      }
      else {
        if (local_22c < 1) {
          cell_00 = -1;
        }
        else {
          cell_00 = -1;
          lVar5 = 0;
          do {
            uVar3 = ref_cell_nodes(ref_facelift->tri_cell,local_1f0[lVar5],&local_188);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x37e,"ref_facelift_edge_face_uv",(ulong)uVar3,"tri nodes");
              uVar7 = (ulong)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)uVar7;
            }
            if ((&local_188)[ref_facelift->tri_cell->node_per] == faceid) {
              if (cell_00 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x381,"ref_facelift_edge_face_uv","two tri found with id and sense=0",
                       0xffffffffffffffff,(long)cell_00);
                uVar7 = 1;
              }
              if (cell_00 != -1) {
                return (REF_STATUS)uVar7;
              }
              cell_00 = local_1f0[lVar5];
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_22c);
        }
        if (cell_00 != -1) {
          uVar3 = ref_cell_nodes(ref_facelift->tri_cell,cell_00,&local_188);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x387,"ref_facelift_edge_face_uv",(ulong)uVar3,"edg tri nodes");
            uVar7 = (ulong)uVar3;
          }
          if (uVar3 != 0) {
            return (REF_STATUS)uVar7;
          }
          local_a8 = local_188;
          local_a4 = local_184;
          local_9c = (&local_188)[ref_facelift->tri_cell->node_per];
          uVar3 = ref_geom_find(local_228,local_118[0],2,faceid,(REF_INT *)&local_208);
          if (uVar3 == 0) {
            if (0 < local_228->descr[(long)(int)local_208 * 6 + 4]) {
              local_1e8[0] = 0.0;
              local_1e8[1] = 1.0;
            }
            if (local_228->descr[(long)(int)local_208 * 6 + 4] < 0) {
              local_1c8[0] = 0.0;
              local_1c8[1] = 1.0;
            }
            uVar3 = ref_geom_find(local_228,local_118[1],2,faceid,(REF_INT *)&local_208);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x39b,"ref_facelift_edge_face_uv",(ulong)uVar3,"geom");
              goto LAB_0012b301;
            }
            if (0 < local_228->descr[(long)(int)local_208 * 6 + 4]) {
              local_1e8[0] = 1.0;
              local_1e8[1] = 0.0;
            }
            bVar2 = true;
            if (local_228->descr[(long)(int)local_208 * 6 + 4] < 0) {
              local_1c8[0] = 1.0;
              local_1c8[1] = 0.0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x391,"ref_facelift_edge_face_uv",(ulong)uVar3,"geom");
LAB_0012b301:
            uVar7 = (ulong)uVar3;
            bVar2 = false;
          }
          pRVar1 = local_228;
          if (!bVar2) {
            return (REF_STATUS)uVar7;
          }
          *local_218 = 0.0;
          local_218[1] = 0.0;
          lVar5 = 0;
          do {
            uVar3 = ref_geom_cell_tuv(pRVar1,local_118[lVar5],&local_a8,2,(REF_DBL *)&local_208,
                                      &local_1ac);
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x3ab,"ref_facelift_edge_face_uv",(ulong)uVar3,"face uv");
            }
            if (uVar3 != 0) {
              return (REF_STATUS)uVar7;
            }
            *local_218 = local_1c8[lVar5] * (double)CONCAT44(local_208._4_4_,(int)local_208) +
                         *local_218;
            local_218[1] = local_1e8[lVar5] * local_200 + local_218[1];
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          uVar3 = ref_facelift_edge_face_watertight
                            (ref_facelift,local_21c,faceid,0,local_1f8,local_218);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x3b2,"ref_facelift_edge_face_uv",(ulong)uVar3,"facelift watertight check");
            return uVar3;
          }
          goto LAB_0012ae3d;
        }
        pcVar8 = "edg tri not found with id";
        uVar6 = 0x385;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           uVar6,"ref_facelift_edge_face_uv",pcVar8);
    RVar4 = 1;
  }
  else {
LAB_0012ae3d:
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_uv(REF_FACELIFT ref_facelift,
                                             REF_INT edgeid, REF_INT faceid,
                                             REF_INT sense, REF_DBL t,
                                             REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT i, cell_node, cell, edg_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cells[2], edg_tri, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_DBL bary[3], clipu[3], clipv[3], faceuv[2];
  RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, uv),
      "edge uv");

  if (ref_facelift_direct(ref_facelift)) {
    if (0 != sense) {
      /* IMPLEMENT sense here, will need surrogate jump support */
      /* uses EGADS edgeUV */
      return REF_SUCCESS;
    }
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t, &cell,
                               bary),
        "enclose");
    RUS(REF_EMPTY, cell, "no enclosing found");
    RSS(ref_node_clip_bary2(bary, clipu), "clip edge bary");
    RSS(ref_node_clip_bary2(bary, clipv), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, edg_nodes),
        "edg nodes");
    RSS(ref_cell_list_with2(ref_facelift_tri(ref_facelift), edg_nodes[0],
                            edg_nodes[1], 2, &ncell, cells),
        "more then two tris for edg");
    RAS(ncell > 0, "no tri found for edg");
    edg_tri = REF_EMPTY;
    for (i = 0; i < ncell; i++) {
      RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cells[i], tri_nodes),
          "tri nodes");
      if (faceid ==
          tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))]) {
        REIS(REF_EMPTY, edg_tri, "two tri found with id and sense=0");
        edg_tri = cells[i];
      }
    }
    RUS(REF_EMPTY, edg_tri, "edg tri not found with id");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), edg_tri, tri_nodes),
        "edg tri nodes");
    linear_nodes[0] = tri_nodes[0];
    linear_nodes[1] = tri_nodes[1];
    linear_nodes[2] = tri_nodes[2];
    linear_nodes[3] =
        tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];

    { /* use the opposite node free uv for degen */
      REF_INT geom;
      RSS(ref_geom_find(ref_geom, edg_nodes[0], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 0.0;
        clipv[1] = 1.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 0.0;
        clipu[1] = 1.0;
      }
      RSS(ref_geom_find(ref_geom, edg_nodes[1], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 1.0;
        clipv[1] = 0.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 1.0;
        clipu[1] = 0.0;
      }
    }

    uv[0] = 0.0;
    uv[1] = 0.0;
    for (cell_node = 0; cell_node < 2; cell_node++) {
      RSS(ref_geom_cell_tuv(ref_geom, edg_nodes[cell_node], linear_nodes,
                            REF_GEOM_FACE, faceuv, &tuv_sense),
          "face uv");
      uv[0] += clipu[cell_node] * faceuv[0];
      uv[1] += clipv[cell_node] * faceuv[1];
    }

    RSS(ref_facelift_edge_face_watertight(ref_facelift, edgeid, faceid, sense,
                                          t, uv),
        "facelift watertight check");

  } else {
  }
  return REF_SUCCESS;
}